

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O1

FunctionRuntimeType<(density::function_type_erasure)1,_double_()> * __thiscall
density::
lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
::reentrant_consume_operation::complete_type(reentrant_consume_operation *this)

{
  bool bVar1;
  uintptr_t uint_pointer;
  
  bVar1 = detail::
          LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
          ::Consume::empty(&this->m_consume_data);
  if (bVar1) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/lf_heter_queue.h"
               ,0xa17);
  }
  return (FunctionRuntimeType<(density::function_type_erasure)1,_double_()> *)
         ((this->m_consume_data).m_control + 1);
}

Assistant:

const RUNTIME_TYPE & complete_type() const noexcept
            {
                DENSITY_ASSERT(!empty());
                return *Base::type_after_control(m_consume_data.m_control);
            }